

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

bool __thiscall
cmCTestTestHandler::AddTest
          (cmCTestTestHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  cmCTest *pcVar2;
  pointer pbVar3;
  size_t sVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  bool collapse;
  pointer pbVar8;
  ostringstream cmCTestLog_msg_3;
  cmCTestTestProperties test;
  long *local_480;
  long local_470 [2];
  undefined1 local_460 [112];
  ios_base local_3f0 [264];
  undefined1 local_2e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  _Alloc_hider local_2c8;
  size_type local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8 [2];
  ios_base local_278 [152];
  _Rb_tree_node_base local_1e0;
  size_t local_1c0;
  ushort local_1b8;
  bool local_1b6;
  undefined8 local_1b4;
  bool local_1ac;
  cmDuration local_1a8;
  bool local_1a0;
  int local_18c;
  bool local_188;
  pointer local_180;
  pointer puStack_178;
  pointer local_170;
  int local_168;
  pointer local_160;
  pointer pbStack_158;
  pointer local_150;
  pointer pbStack_148;
  pointer local_140;
  pointer pbStack_138;
  _Rb_tree_node_base local_128;
  size_t local_108;
  _Rb_tree_node_base local_f8;
  size_t local_d8;
  _Rb_tree_node_base local_c8;
  size_t local_a8;
  _Rb_tree_node_base local_98;
  size_t local_78;
  _Rb_tree_node_base local_68;
  size_t local_48;
  element_type *peStack_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e8,"Add test: ",10);
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_2e8,(pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x936,(char *)local_460._0_8_,(this->super_cmCTestGenericHandler).Quiet);
  if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
    operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e8);
  std::ios_base::~ios_base(local_278);
  if (((this->UseExcludeRegExpFlag != true) || (this->UseExcludeRegExpFirst != true)) ||
     (bVar5 = cmsys::RegularExpression::find
                        (&this->ExcludeTestsRegularExpression,(pbVar1->_M_dataplus)._M_p,
                         &(this->ExcludeTestsRegularExpression).regmatch), !bVar5)) {
    pbVar8 = (this->CustomTestsIgnore).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (this->CustomTestsIgnore).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this->MemCheck == true) {
      if (pbVar8 != pbVar3) {
        sVar4 = pbVar1->_M_string_length;
        do {
          if ((pbVar8->_M_string_length == sVar4) &&
             ((sVar4 == 0 ||
              (iVar6 = bcmp((pbVar8->_M_dataplus)._M_p,(pbVar1->_M_dataplus)._M_p,sVar4), iVar6 == 0
              )))) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2e8,"Ignore memcheck: ",0x11);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_2e8,(pbVar8->_M_dataplus)._M_p,
                                pbVar8->_M_string_length);
            std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestTestHandler.cxx"
                         ,0x948,(char *)local_460._0_8_,(this->super_cmCTestGenericHandler).Quiet);
LAB_001aa3c8:
            if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
              operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e8);
            std::ios_base::~ios_base(local_278);
            return true;
          }
          pbVar8 = pbVar8 + 1;
        } while (pbVar8 != pbVar3);
      }
    }
    else if (pbVar8 != pbVar3) {
      sVar4 = pbVar1->_M_string_length;
      do {
        if ((pbVar8->_M_string_length == sVar4) &&
           ((sVar4 == 0 ||
            (iVar6 = bcmp((pbVar8->_M_dataplus)._M_p,(pbVar1->_M_dataplus)._M_p,sVar4), iVar6 == 0))
           )) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2e8,"Ignore test: ",0xd);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_2e8,(pbVar8->_M_dataplus)._M_p,
                              pbVar8->_M_string_length);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestTestHandler.cxx"
                       ,0x957,(char *)local_460._0_8_,(this->super_cmCTestGenericHandler).Quiet);
          goto LAB_001aa3c8;
        }
        pbVar8 = pbVar8 + 1;
      } while (pbVar8 != pbVar3);
    }
    local_2e8._0_8_ = local_2e8 + 0x10;
    local_2e8._8_8_ = 0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_p = (pointer)&local_2b8;
    local_2c0 = 0;
    local_2b8._M_local_buf[0] = '\0';
    local_1e0._M_color = _S_red;
    local_1e0._M_parent = (_Base_ptr)0x0;
    memset(local_2a8,0,0xc0);
    local_1c0 = 0;
    local_180 = (pointer)0x0;
    puStack_178 = (pointer)0x0;
    local_170 = (pointer)0x0;
    local_128._M_left = &local_128;
    local_128._M_color = _S_red;
    local_128._M_parent = (_Base_ptr)0x0;
    local_160 = (pointer)0x0;
    pbStack_158 = (pointer)0x0;
    local_150 = (pointer)0x0;
    pbStack_148 = (pointer)0x0;
    local_140 = (pointer)0x0;
    pbStack_138 = (pointer)0x0;
    local_108 = 0;
    local_f8._M_left = &local_f8;
    local_f8._M_color = _S_red;
    local_f8._M_parent = (_Base_ptr)0x0;
    local_d8 = 0;
    local_c8._M_left = &local_c8;
    local_c8._M_color = _S_red;
    local_c8._M_parent = (_Base_ptr)0x0;
    local_a8 = 0;
    local_98._M_left = &local_98;
    local_98._M_color = _S_red;
    local_98._M_parent = (_Base_ptr)0x0;
    local_78 = 0;
    local_68._M_left = &local_68;
    local_68._M_color = _S_red;
    local_68._M_parent = (_Base_ptr)0x0;
    local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_48 = 0;
    peStack_40 = (element_type *)0x0;
    local_1e0._M_left = &local_1e0;
    local_1e0._M_right = &local_1e0;
    local_128._M_right = local_128._M_left;
    local_f8._M_right = local_f8._M_left;
    local_c8._M_right = local_c8._M_left;
    local_98._M_right = local_98._M_left;
    local_68._M_right = local_68._M_left;
    std::__cxx11::string::_M_assign((string *)local_2e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(local_2a8,args);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)local_460,(SystemTools *)0x1,collapse);
    std::__cxx11::string::operator=((string *)&local_2c8,(string *)local_460);
    if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
      operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_460,"Set test directory: ",0x14);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_460,local_2c8._M_p,local_2c0);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x962,(char *)local_480,(this->super_cmCTestGenericHandler).Quiet);
    if (local_480 != local_470) {
      operator_delete(local_480,local_470[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
    std::ios_base::~ios_base(local_3f0);
    local_1b8 = 1;
    local_1b6 = false;
    local_1ac = false;
    local_1a8.__r = 0.0;
    local_1a0 = false;
    local_1b4._0_4_ = 0.0;
    local_1b4._4_4_ = 0;
    local_18c = 1;
    local_188 = false;
    local_168 = -1;
    if (((this->UseIncludeRegExpFlag == true) &&
        (bVar5 = cmsys::RegularExpression::find
                           (&this->IncludeTestsRegularExpression,(pbVar1->_M_dataplus)._M_p,
                            &(this->IncludeTestsRegularExpression).regmatch), !bVar5)) ||
       ((this->UseExcludeRegExpFlag == true &&
        ((this->UseExcludeRegExpFirst == false &&
         (bVar5 = cmsys::RegularExpression::find
                            (&this->ExcludeTestsRegularExpression,(pbVar1->_M_dataplus)._M_p,
                             &(this->ExcludeTestsRegularExpression).regmatch), bVar5)))))) {
      local_1b8 = local_1b8 & 0xff00;
    }
    std::
    vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
    ::push_back(&this->TestList,(value_type *)local_2e8);
    cmCTestTestProperties::~cmCTestTestProperties((cmCTestTestProperties *)local_2e8);
  }
  return true;
}

Assistant:

bool cmCTestTestHandler::AddTest(const std::vector<std::string>& args)
{
  const std::string& testname = args[0];
  cmCTestOptionalLog(this->CTest, DEBUG, "Add test: " << args[0] << std::endl,
                     this->Quiet);

  if (this->UseExcludeRegExpFlag && this->UseExcludeRegExpFirst &&
      this->ExcludeTestsRegularExpression.find(testname)) {
    return true;
  }
  if (this->MemCheck) {
    std::vector<std::string>::iterator it;
    bool found = false;
    for (it = this->CustomTestsIgnore.begin();
         it != this->CustomTestsIgnore.end(); ++it) {
      if (*it == testname) {
        found = true;
        break;
      }
    }
    if (found) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Ignore memcheck: " << *it << std::endl, this->Quiet);
      return true;
    }
  } else {
    std::vector<std::string>::iterator it;
    bool found = false;
    for (it = this->CustomTestsIgnore.begin();
         it != this->CustomTestsIgnore.end(); ++it) {
      if (*it == testname) {
        found = true;
        break;
      }
    }
    if (found) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Ignore test: " << *it << std::endl, this->Quiet);
      return true;
    }
  }

  cmCTestTestProperties test;
  test.Name = testname;
  test.Args = args;
  test.Directory = cmSystemTools::GetCurrentWorkingDirectory();
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "Set test directory: " << test.Directory << std::endl,
                     this->Quiet);

  test.IsInBasedOnREOptions = true;
  test.WillFail = false;
  test.Disabled = false;
  test.RunSerial = false;
  test.Timeout = cmDuration::zero();
  test.ExplicitTimeout = false;
  test.Cost = 0;
  test.Processors = 1;
  test.WantAffinity = false;
  test.SkipReturnCode = -1;
  test.PreviousRuns = 0;
  if (this->UseIncludeRegExpFlag &&
      !this->IncludeTestsRegularExpression.find(testname)) {
    test.IsInBasedOnREOptions = false;
  } else if (this->UseExcludeRegExpFlag && !this->UseExcludeRegExpFirst &&
             this->ExcludeTestsRegularExpression.find(testname)) {
    test.IsInBasedOnREOptions = false;
  }
  this->TestList.push_back(test);
  return true;
}